

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O1

QTextLayoutStruct * __thiscall
QTextDocumentLayoutPrivate::layoutCell
          (QTextLayoutStruct *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextTable *t,
          QTextTableCell *cell,QFixed width,int layoutFrom,int layoutTo,QTextTableData *td,
          QFixed absoluteTableY,bool withPageBreaks)

{
  QTextFrame *pQVar1;
  double dVar2;
  qreal qVar3;
  uint uVar4;
  Iterator it;
  int *piVar5;
  QDebug this_00;
  char cVar6;
  QFixed QVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QTextFrameLayoutData *pQVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QSizeF QVar20;
  QDebug local_98;
  iterator local_90;
  QString local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcTable();
  if (((byte)lcTable::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_40 = lcTable::category.name;
    QMessageLogger::debug();
    this_00.stream = local_98.stream;
    QVar19.m_data = (storage_type *)0xa;
    QVar19.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<(&(this_00.stream)->ts,&local_70);
    piVar5 = (int *)CONCAT44(local_70.d.d._4_4_,(int)local_70.d.d);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_70.d.d._4_4_,(int)local_70.d.d),2,0x10);
      }
    }
    if ((local_98.stream)->space == true) {
      QTextStream::operator<<(&(local_98.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_98);
  }
  memcpy(__return_storage_ptr__,&DAT_006bc7b0,0x90);
  __return_storage_ptr__->contentsWidth = 0;
  __return_storage_ptr__->minimumWidth = 0;
  __return_storage_ptr__->x_left = 0;
  __return_storage_ptr__->x_right = 0;
  __return_storage_ptr__->frameY = 0;
  __return_storage_ptr__->y = 0;
  (__return_storage_ptr__->maximumWidth).val = 0x1fffffc0;
  __return_storage_ptr__->fullLayout = false;
  (__return_storage_ptr__->pendingFloats).d.d = (Data *)0x0;
  (__return_storage_ptr__->pendingFloats).d.ptr = (QTextFrame **)0x0;
  (__return_storage_ptr__->pendingFloats).d.size = 0;
  __return_storage_ptr__->pageHeight = 0;
  __return_storage_ptr__->pageBottom = 0;
  __return_storage_ptr__->pageTopMargin = 0;
  __return_storage_ptr__->pageBottomMargin = 0;
  (__return_storage_ptr__->updateRect).xp = 0.0;
  (__return_storage_ptr__->updateRect).yp = 0.0;
  (__return_storage_ptr__->updateRect).w = 0.0;
  (__return_storage_ptr__->updateRect).h = 0.0;
  (__return_storage_ptr__->updateRectForFloats).xp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).yp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).w = 0.0;
  (__return_storage_ptr__->updateRectForFloats).h = 0.0;
  __return_storage_ptr__->frame = &t->super_QTextFrame;
  iVar18 = 0;
  (__return_storage_ptr__->minimumWidth).val = 0;
  (__return_storage_ptr__->y).val = 0;
  QVar7 = QTextTableData::topPadding(td,t,cell);
  if (withPageBreaks) {
    iVar8 = QTextTableCell::row(cell);
    (__return_storage_ptr__->frameY).val =
         QVar7.val + absoluteTableY.val + (td->rowPositions).d.ptr[iVar8].val;
  }
  (__return_storage_ptr__->x_left).val = 0;
  (__return_storage_ptr__->x_right).val = width.val;
  QVar20 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  uVar9 = (uint)(QVar20.ht * 64.0);
  uVar15 = 0x1fffffc0;
  if (withPageBreaks) {
    uVar15 = uVar9;
  }
  if ((int)uVar9 < 0) {
    uVar15 = 0x1fffffc0;
  }
  (__return_storage_ptr__->pageHeight).val = uVar15;
  if (uVar15 != 0) {
    uVar16 = (__return_storage_ptr__->frameY).val + (__return_storage_ptr__->y).val;
    uVar9 = -uVar16;
    if (0 < (int)uVar16) {
      uVar9 = uVar16;
    }
    uVar4 = -uVar15;
    if (0 < (int)uVar15) {
      uVar4 = uVar15;
    }
    iVar8 = (int)(((ulong)(uVar4 >> 1) + (ulong)uVar9 * 0x40) / (ulong)uVar4);
    iVar18 = -iVar8;
    if (-1 < (int)(uVar16 ^ uVar15)) {
      iVar18 = iVar8;
    }
    iVar18 = iVar18 >> 6;
  }
  iVar8 = (td->super_QTextFrameData).effectiveTopMargin.val;
  iVar12 = (td->cellSpacing).val;
  iVar11 = (td->super_QTextFrameData).border.val;
  QTextTableCell::format((QTextTableCell *)&local_70);
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  QTextFormat::property((QVariant *)&local_58,(QTextFormat *)&local_70,0x4812);
  cVar6 = ::QVariant::isNull();
  if (cVar6 == '\0') {
    dVar2 = (double)::QVariant::toReal((bool *)local_58.data);
    iVar10 = (int)(dVar2 * td->deviceScale * 64.0);
  }
  else {
    iVar10 = (td->cellPadding).val;
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  (__return_storage_ptr__->pageTopMargin).val = iVar8 + iVar12 + iVar11 + iVar10;
  QTextFormat::~QTextFormat((QTextFormat *)&local_70);
  QTextTable::format((QTextTable *)&local_58);
  iVar8 = QTextFormat::intProperty((QTextFormat *)&local_58,0x4104);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if ((0 < iVar8) && (td->borderCollapse != false)) {
    QTextTableCell::column(cell);
    QTextTable::cellAt((QTextTable *)&local_70,(int)t,iVar8 + -1);
    axisEdgeData((EdgeData *)&local_58,t,td,(QTextTableCell *)&local_70,BottomEdge);
    qVar3 = scaleToDevice(this,(qreal)CONCAT44(local_58._4_4_,local_58._0_4_));
    (__return_storage_ptr__->pageTopMargin).val =
         (__return_storage_ptr__->pageTopMargin).val + (int)(qVar3 * 0.5 * 64.0);
  }
  iVar8 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  iVar12 = (td->cellSpacing).val;
  iVar11 = (td->effectiveBottomBorder).val;
  QVar7 = QTextTableData::bottomPadding(td,t,cell);
  iVar11 = QVar7.val + iVar8 + iVar12 + iVar11;
  (__return_storage_ptr__->pageBottomMargin).val = iVar11;
  iVar8 = (__return_storage_ptr__->y).val;
  iVar12 = (__return_storage_ptr__->pageHeight).val;
  (__return_storage_ptr__->pageBottom).val = (iVar18 + 1) * iVar12 - iVar11;
  __return_storage_ptr__->fullLayout = true;
  iVar18 = (iVar12 * iVar18 + (__return_storage_ptr__->pageTopMargin).val) -
           (__return_storage_ptr__->frameY).val;
  if (iVar18 < iVar8) {
    iVar18 = iVar8;
  }
  (__return_storage_ptr__->y).val = iVar18;
  local_58._16_4_ = 0xaaaaaaaa;
  local_58._20_4_ = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = 0xaaaaaaaa;
  local_58._12_4_ = 0xaaaaaaaa;
  iVar18 = QTextTableCell::row(cell);
  iVar8 = QTextTableCell::column(cell);
  iVar12 = QTextTable::rows(t);
  local_70.d.d._0_4_ = iVar12 * iVar8 + iVar18;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)&local_58,&td->childFrameMap,(int *)&local_70);
  if (CONCAT44(local_58._20_4_,local_58._16_4_) != 0) {
    uVar17 = 0;
    do {
      pQVar1 = *(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar17 * 8);
      pQVar13 = QTextFrame::layoutData(pQVar1);
      if (pQVar13 == (QTextFrameLayoutData *)0x0) {
        lVar14 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar14 == 0) {
          pQVar13 = (QTextFrameLayoutData *)operator_new(0x78);
          pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
          pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          pQVar13 = (QTextFrameLayoutData *)operator_new(0x160);
          pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
          pQVar13[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(pQVar13 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar1,pQVar13);
      }
      *(undefined1 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 1;
      uVar17 = uVar17 + 1;
    } while (uVar17 < CONCAT44(local_58._20_4_,local_58._16_4_));
  }
  QTextTableCell::begin(&local_90,cell);
  it.b = local_90.b;
  it.e = local_90.e;
  it.f = local_90.f;
  it.cf = local_90.cf;
  it.cb = local_90.cb;
  it._28_4_ = local_90._28_4_;
  layoutFlow(this,it,__return_storage_ptr__,layoutFrom,layoutTo,width);
  if (CONCAT44(local_58._20_4_,local_58._16_4_) == 0) {
    iVar18 = 0;
  }
  else {
    uVar17 = 0;
    iVar18 = 0;
    do {
      pQVar1 = *(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar17 * 8);
      pQVar13 = QTextFrame::layoutData(pQVar1);
      if (pQVar13 == (QTextFrameLayoutData *)0x0) {
        lVar14 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
        if (lVar14 == 0) {
          pQVar13 = (QTextFrameLayoutData *)operator_new(0x78);
          pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
          pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
        }
        else {
          pQVar13 = (QTextFrameLayoutData *)operator_new(0x160);
          pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
          pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
          pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
          pQVar13[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          pQVar13[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          memset(pQVar13 + 0x11,0,0xc0);
        }
        QTextFrame::setLayoutData(pQVar1,pQVar13);
      }
      QTextFrame::frameFormat((QTextFrame *)&local_70);
      iVar8 = QTextFormat::intProperty((QTextFormat *)&local_70,0x800);
      QTextFormat::~QTextFormat((QTextFormat *)&local_70);
      if (iVar8 != 0) {
        iVar12 = *(int *)((long)&pQVar13[1]._vptr_QTextFrameLayoutData + 4) +
                 *(int *)((long)&pQVar13[2]._vptr_QTextFrameLayoutData + 4);
        iVar8 = (__return_storage_ptr__->y).val;
        if (iVar12 < iVar8) {
          iVar12 = iVar8;
        }
        (__return_storage_ptr__->y).val = iVar12;
      }
      iVar8 = *(int *)((long)&pQVar13[8]._vptr_QTextFrameLayoutData + 4);
      if (iVar8 < iVar18) {
        iVar8 = iVar18;
      }
      iVar18 = iVar8;
      uVar17 = uVar17 + 1;
    } while (uVar17 < CONCAT44(local_58._20_4_,local_58._16_4_));
  }
  iVar8 = (__return_storage_ptr__->minimumWidth).val;
  iVar12 = (__return_storage_ptr__->maximumWidth).val;
  if (iVar12 <= iVar18) {
    iVar12 = iVar18;
  }
  (__return_storage_ptr__->maximumWidth).val = iVar12;
  if (iVar18 < iVar8) {
    iVar18 = iVar8;
  }
  (__return_storage_ptr__->minimumWidth).val = iVar18;
  pQVar13 = QTextFrame::layoutData(&t->super_QTextFrame);
  if (pQVar13 == (QTextFrameLayoutData *)0x0) {
    lVar14 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar14 == 0) {
      pQVar13 = (QTextFrameLayoutData *)operator_new(0x78);
      pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007edfd0;
      pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
      pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      pQVar13 = (QTextFrameLayoutData *)operator_new(0x160);
      pQVar13[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined4 *)&pQVar13[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      pQVar13[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&pQVar13[0xb]._vptr_QTextFrameLayoutData = 0x101;
      pQVar13[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007ee180;
      pQVar13[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      pQVar13[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      memset(pQVar13 + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(&t->super_QTextFrame,pQVar13);
  }
  QList<QPointer<QTextFrame>_>::clear((QList<QPointer<QTextFrame>_> *)(pQVar13 + 0xc));
  piVar5 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTextLayoutStruct QTextDocumentLayoutPrivate::layoutCell(QTextTable *t, const QTextTableCell &cell, QFixed width,
                                                        int layoutFrom, int layoutTo, QTextTableData *td,
                                                        QFixed absoluteTableY, bool withPageBreaks)
{
    qCDebug(lcTable) << "layoutCell";
    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = t;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.y = 0;

    const QFixed topPadding = td->topPadding(t, cell);
    if (withPageBreaks) {
        layoutStruct.frameY = absoluteTableY + td->rowPositions.at(cell.row()) + topPadding;
    }
    layoutStruct.x_left = 0;
    layoutStruct.x_right = width;
    // we get called with different widths all the time (for example for figuring
    // out the min/max widths), so we always have to do the full layout ;(
    // also when for example in a table layoutFrom/layoutTo affect only one cell,
    // making that one cell grow the available width of the other cells may change
    // (shrink) and therefore when layoutCell gets called for them they have to
    // be re-laid out, even if layoutFrom/layoutTo is not in their range. Hence
    // this line:

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0 || !withPageBreaks)
        layoutStruct.pageHeight = QFIXED_MAX;
    const int currentPage = layoutStruct.currentPage();

    layoutStruct.pageTopMargin = td->effectiveTopMargin
            + td->cellSpacing
            + td->border
            + td->paddingProperty(cell.format(), QTextFormat::TableCellTopPadding); // top cell-border is not repeated

#ifndef QT_NO_CSSPARSER
    const int headerRowCount = t->format().headerRowCount();
    if (td->borderCollapse && headerRowCount > 0) {
        // consider the header row's bottom edge width
        qreal headerRowBottomBorderWidth = axisEdgeData(t, td, t->cellAt(headerRowCount - 1, cell.column()), QCss::BottomEdge).width;
        layoutStruct.pageTopMargin += QFixed::fromReal(scaleToDevice(headerRowBottomBorderWidth) / 2);
    }
#endif

    layoutStruct.pageBottomMargin = td->effectiveBottomMargin + td->cellSpacing + td->effectiveBottomBorder + td->bottomPadding(t, cell);
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    layoutStruct.fullLayout = true;

    QFixed pageTop = currentPage * layoutStruct.pageHeight + layoutStruct.pageTopMargin - layoutStruct.frameY;
    layoutStruct.y = qMax(layoutStruct.y, pageTop);

    const QList<QTextFrame *> childFrames = td->childFrameMap.values(cell.row() + cell.column() * t->rows());
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);
        cd->sizeDirty = true;
    }

    layoutFlow(cell.begin(), &layoutStruct, layoutFrom, layoutTo, width);

    QFixed floatMinWidth;

    // floats that are located inside the text (like inline images) aren't taken into account by
    // layoutFlow with regards to the cell height (layoutStruct->y), so for a safety measure we
    // do that here. For example with <td><img align="right" src="..." />blah</td>
    // when the image happens to be higher than the text
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);

        if (frame->frameFormat().position() != QTextFrameFormat::InFlow)
            layoutStruct.y = qMax(layoutStruct.y, cd->position.y + cd->size.height);

        floatMinWidth = qMax(floatMinWidth, cd->minimumWidth);
    }

    // constraint the maximum/minimumWidth by the minimum width of the fixed size floats,
    // to keep them visible
    layoutStruct.maximumWidth = qMax(layoutStruct.maximumWidth, floatMinWidth);
    layoutStruct.minimumWidth = qMax(layoutStruct.minimumWidth, floatMinWidth);

    // as floats in cells get added to the table's float list but must not affect
    // floats in other cells we must clear the list here.
    data(t)->floats.clear();

//    qDebug("layoutCell done");

    return layoutStruct;
}